

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

void MallocBlock::ProcessFreeQueue(MallocBlock *b,size_t size,int max_free_queue_size)

{
  MallocBlock *pMVar1;
  ThreadCache *pTVar2;
  void *pvVar3;
  Span *pSVar4;
  long lVar5;
  FreeQueue<MallocBlockQueueEntry> *pFVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  undefined8 *in_FS_OFFSET;
  MallocBlockQueueEntry local_408;
  undefined1 auStack_368 [8];
  MallocBlockQueueEntry entries [4];
  undefined1 local_e0 [8];
  MallocBlockQueueEntry new_entry;
  
  lVar5 = 0;
  do {
    *(undefined4 *)((long)entries[0].deleter_pcs + lVar5 + 0x78) = 0;
    *(undefined8 *)(auStack_368 + lVar5) = 0;
    *(undefined8 *)((long)entries[0].deleter_pcs + lVar5 + -0x10) = 0;
    lVar5 = lVar5 + 0xa0;
  } while (lVar5 != 0x280);
  MallocBlockQueueEntry::MallocBlockQueueEntry((MallocBlockQueueEntry *)local_e0,b,size);
  SpinLock::Lock(&free_queue_lock_);
  if (free_queue_ == (FreeQueue<MallocBlockQueueEntry> *)0x0) {
    pFVar6 = (FreeQueue<MallocBlockQueueEntry> *)operator_new(0x28008);
    FreeQueue<MallocBlockQueueEntry>::FreeQueue(pFVar6);
    free_queue_ = pFVar6;
  }
  pFVar6 = free_queue_;
  if ((free_queue_->q_front_ + 1) % 0x400 == free_queue_->q_back_) {
    syscall(1,2,"Check failed: !free_queue_->Full(): Free queue mustn\'t be full!\n",0x40);
    abort();
  }
  sVar11 = free_queue_size_;
  if (b != (MallocBlock *)0x0) {
    sVar11 = free_queue_size_ + size + 0xa0;
    free_queue_size_ = sVar11;
    memcpy(free_queue_->q_ + free_queue_->q_front_,local_e0,0xa0);
    pFVar6->q_front_ = (pFVar6->q_front_ + 1) % 0x400;
  }
  new_entry.deleter_threadid = (uintptr_t)max_free_queue_size;
  uVar7 = 0;
  while ((new_entry.deleter_threadid < sVar11 || ((pFVar6->q_front_ + 1) % 0x400 == pFVar6->q_back_)
         )) {
    FreeQueue<MallocBlockQueueEntry>::Pop(&local_408,pFVar6);
    memcpy(&entries[uVar7 - 1].deleter_threadid,&local_408,0xa0);
    free_queue_size_ = (free_queue_size_ - (long)entries[uVar7].block) - 0xa0;
    uVar12 = (int)uVar7 + 1;
    uVar7 = (ulong)uVar12;
    pFVar6 = free_queue_;
    sVar11 = free_queue_size_;
    if (uVar12 == 4) {
      SpinLock::Unlock(&free_queue_lock_);
      for (lVar5 = 0; lVar5 != 0x280; lVar5 = lVar5 + 0xa0) {
        CheckForDanglingWrites((MallocBlockQueueEntry *)(auStack_368 + lVar5));
        pMVar1 = ((MallocBlockQueueEntry *)(auStack_368 + lVar5))->block;
        pTVar2 = (ThreadCache *)*in_FS_OFFSET;
        uVar7 = (ulong)pMVar1 >> 0xd;
        uVar9 = *(ulong *)(tcmalloc::Static::pageheap_ + (uVar7 & 0xffff) * 8 + 0x10) ^
                uVar7 & 0x7ffffffff0000;
        if (uVar9 < 0x80) {
LAB_00118389:
          uVar7 = uVar9 & 0xffffffff;
          if (pTVar2 == (ThreadCache *)0x0) {
            if (tcmalloc::Static::inited_ == '\0') goto LAB_00118469;
            pMVar1->size1_ = 0;
            tcmalloc::CentralFreeList::InsertRange
                      ((CentralFreeList *)(tcmalloc::Static::central_cache_ + uVar7 * 0x4c0),pMVar1,
                       pMVar1,1);
          }
          else {
            uVar12 = pTVar2->list_[uVar7].length_ + 1;
            pvVar3 = pTVar2->list_[uVar7].list_;
            pTVar2->list_[uVar7].list_ = pMVar1;
            pMVar1->size1_ = (size_t)pvVar3;
            pTVar2->list_[uVar7].length_ = uVar12;
            if (pTVar2->list_[uVar7].max_length_ < uVar12) {
              tcmalloc::ThreadCache::ListTooLong(pTVar2,pTVar2->list_ + uVar7,(uint32_t)uVar9);
            }
            else {
              iVar8 = pTVar2->size_ + pTVar2->list_[uVar7].size_;
              pTVar2->size_ = iVar8;
              if (pTVar2->max_size_ < iVar8) {
                tcmalloc::ThreadCache::Scavenge(pTVar2);
              }
            }
          }
        }
        else if ((((ulong)pMVar1 >> 0x30 == 0) &&
                 (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)pMVar1 >> 0x1f) * 8 + 0x80010) !=
                  0)) && (pSVar4 = *(Span **)(*(long *)(tcmalloc::Static::pageheap_ +
                                                       ((ulong)pMVar1 >> 0x1f) * 8 + 0x80010) +
                                             (ulong)((uint)uVar7 & 0x3ffff) * 8),
                         pSVar4 != (Span *)0x0)) {
          uVar9 = (ulong)(byte)pSVar4->field_0x2a;
          if (uVar9 != 0) {
            *(ulong *)(tcmalloc::Static::pageheap_ + (uVar7 & 0xffff) * 8 + 0x10) =
                 uVar7 & 0x7ffffffff0000 | uVar9;
            goto LAB_00118389;
          }
          anon_unknown.dwarf_5263::do_free_pages(pSVar4,pMVar1);
        }
        else {
LAB_00118469:
          anon_unknown.dwarf_5263::free_null_or_invalid(pMVar1,(_func_void_void_ptr *)pMVar1);
        }
      }
      SpinLock::Lock(&free_queue_lock_);
      uVar7 = 0;
      pFVar6 = free_queue_;
      sVar11 = free_queue_size_;
    }
  }
  SpinLock::Unlock(&free_queue_lock_);
  lVar5 = 0;
  if ((int)uVar7 < 1) {
    uVar7 = 0;
  }
  do {
    if (uVar7 * 0xa0 == lVar5) {
      return;
    }
    CheckForDanglingWrites((MallocBlockQueueEntry *)(auStack_368 + lVar5));
    pMVar1 = ((MallocBlockQueueEntry *)(auStack_368 + lVar5))->block;
    pTVar2 = (ThreadCache *)*in_FS_OFFSET;
    uVar9 = (ulong)pMVar1 >> 0xd;
    uVar10 = *(ulong *)(tcmalloc::Static::pageheap_ + (uVar9 & 0xffff) * 8 + 0x10) ^
             uVar9 & 0x7ffffffff0000;
    if (uVar10 < 0x80) {
LAB_0011851a:
      uVar9 = uVar10 & 0xffffffff;
      if (pTVar2 == (ThreadCache *)0x0) {
        if (tcmalloc::Static::inited_ == '\0') goto LAB_001185fa;
        pMVar1->size1_ = 0;
        tcmalloc::CentralFreeList::InsertRange
                  ((CentralFreeList *)(tcmalloc::Static::central_cache_ + uVar9 * 0x4c0),pMVar1,
                   pMVar1,1);
      }
      else {
        uVar12 = pTVar2->list_[uVar9].length_ + 1;
        pvVar3 = pTVar2->list_[uVar9].list_;
        pTVar2->list_[uVar9].list_ = pMVar1;
        pMVar1->size1_ = (size_t)pvVar3;
        pTVar2->list_[uVar9].length_ = uVar12;
        if (pTVar2->list_[uVar9].max_length_ < uVar12) {
          tcmalloc::ThreadCache::ListTooLong(pTVar2,pTVar2->list_ + uVar9,(uint32_t)uVar10);
        }
        else {
          iVar8 = pTVar2->size_ + pTVar2->list_[uVar9].size_;
          pTVar2->size_ = iVar8;
          if (pTVar2->max_size_ < iVar8) {
            tcmalloc::ThreadCache::Scavenge(pTVar2);
          }
        }
      }
    }
    else if ((((ulong)pMVar1 >> 0x30 == 0) &&
             (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)pMVar1 >> 0x1f) * 8 + 0x80010) != 0))
            && (pSVar4 = *(Span **)(*(long *)(tcmalloc::Static::pageheap_ +
                                             ((ulong)pMVar1 >> 0x1f) * 8 + 0x80010) +
                                   (ulong)((uint)uVar9 & 0x3ffff) * 8), pSVar4 != (Span *)0x0)) {
      uVar10 = (ulong)(byte)pSVar4->field_0x2a;
      if (uVar10 != 0) {
        *(ulong *)(tcmalloc::Static::pageheap_ + (uVar9 & 0xffff) * 8 + 0x10) =
             uVar9 & 0x7ffffffff0000 | uVar10;
        goto LAB_0011851a;
      }
      anon_unknown.dwarf_5263::do_free_pages(pSVar4,pMVar1);
    }
    else {
LAB_001185fa:
      anon_unknown.dwarf_5263::free_null_or_invalid(pMVar1,(_func_void_void_ptr *)pMVar1);
    }
    lVar5 = lVar5 + 0xa0;
  } while( true );
}

Assistant:

static void ProcessFreeQueue(MallocBlock* b, size_t size,
                               int max_free_queue_size) {
    // MallocBlockQueueEntry are about 144 in size, so we can only
    // use a small array of them on the stack.
    MallocBlockQueueEntry entries[4];
    int num_entries = 0;
    MallocBlockQueueEntry new_entry(b, size);
    free_queue_lock_.Lock();
    if (free_queue_ == nullptr)
      free_queue_ = new FreeQueue<MallocBlockQueueEntry>;
    RAW_CHECK(!free_queue_->Full(), "Free queue mustn't be full!");

    if (b != nullptr) {
      free_queue_size_ += size + sizeof(MallocBlockQueueEntry);
      free_queue_->Push(new_entry);
    }

    // Free blocks until the total size of unfreed blocks no longer exceeds
    // max_free_queue_size, and the free queue has at least one free
    // space in it.
    while (free_queue_size_ > max_free_queue_size || free_queue_->Full()) {
      RAW_CHECK(num_entries < arraysize(entries), "entries array overflow");
      entries[num_entries] = free_queue_->Pop();
      free_queue_size_ -=
          entries[num_entries].size + sizeof(MallocBlockQueueEntry);
      num_entries++;
      if (num_entries == arraysize(entries)) {
        // The queue will not be full at this point, so it is ok to
        // release the lock.  The queue may still contain more than
        // max_free_queue_size, but this is not a strict invariant.
        free_queue_lock_.Unlock();
        for (int i = 0; i < num_entries; i++) {
          CheckForDanglingWrites(entries[i]);
          do_free(entries[i].block);
        }
        num_entries = 0;
        free_queue_lock_.Lock();
      }
    }
    free_queue_lock_.Unlock();
    for (int i = 0; i < num_entries; i++) {
      CheckForDanglingWrites(entries[i]);
      do_free(entries[i].block);
    }
  }